

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# service_publication.cpp
# Opt level: O0

void __thiscall miniros::ServicePublication::dropAllConnections(ServicePublication *this)

{
  bool bVar1;
  element_type *this_00;
  vector<std::shared_ptr<miniros::ServiceClientLink>,_std::allocator<std::shared_ptr<miniros::ServiceClientLink>_>_>
  *in_RDI;
  ServiceClientLinkPtr link;
  iterator __end1;
  iterator __begin1;
  vector<std::shared_ptr<miniros::ServiceClientLink>,_std::allocator<std::shared_ptr<miniros::ServiceClientLink>_>_>
  *__range1;
  DropReason in_stack_0000004c;
  scoped_lock<std::mutex> lock;
  vector<std::shared_ptr<miniros::ServiceClientLink>,_std::allocator<std::shared_ptr<miniros::ServiceClientLink>_>_>
  local_links;
  mutex_type *in_stack_ffffffffffffff88;
  ConnectionPtr *in_stack_ffffffffffffff90;
  undefined8 in_stack_ffffffffffffffa0;
  __normal_iterator<std::shared_ptr<miniros::ServiceClientLink>_*,_std::vector<std::shared_ptr<miniros::ServiceClientLink>,_std::allocator<std::shared_ptr<miniros::ServiceClientLink>_>_>_>
  local_48 [5];
  __pthread_internal_list local_20 [2];
  
  std::
  vector<std::shared_ptr<miniros::ServiceClientLink>,_std::allocator<std::shared_ptr<miniros::ServiceClientLink>_>_>
  ::vector((vector<std::shared_ptr<miniros::ServiceClientLink>,_std::allocator<std::shared_ptr<miniros::ServiceClientLink>_>_>
            *)0x4a97cd);
  std::scoped_lock<std::mutex>::scoped_lock
            ((scoped_lock<std::mutex> *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  std::
  vector<std::shared_ptr<miniros::ServiceClientLink>,_std::allocator<std::shared_ptr<miniros::ServiceClientLink>_>_>
  ::swap((vector<std::shared_ptr<miniros::ServiceClientLink>,_std::allocator<std::shared_ptr<miniros::ServiceClientLink>_>_>
          *)in_stack_ffffffffffffffa0,in_RDI);
  std::scoped_lock<std::mutex>::~scoped_lock((scoped_lock<std::mutex> *)0x4a9805);
  local_48[1]._M_current = (shared_ptr<miniros::ServiceClientLink> *)local_20;
  local_48[0]._M_current =
       (shared_ptr<miniros::ServiceClientLink> *)
       std::
       vector<std::shared_ptr<miniros::ServiceClientLink>,_std::allocator<std::shared_ptr<miniros::ServiceClientLink>_>_>
       ::begin((vector<std::shared_ptr<miniros::ServiceClientLink>,_std::allocator<std::shared_ptr<miniros::ServiceClientLink>_>_>
                *)in_stack_ffffffffffffff88);
  std::
  vector<std::shared_ptr<miniros::ServiceClientLink>,_std::allocator<std::shared_ptr<miniros::ServiceClientLink>_>_>
  ::end((vector<std::shared_ptr<miniros::ServiceClientLink>,_std::allocator<std::shared_ptr<miniros::ServiceClientLink>_>_>
         *)in_stack_ffffffffffffff88);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<std::shared_ptr<miniros::ServiceClientLink>_*,_std::vector<std::shared_ptr<miniros::ServiceClientLink>,_std::allocator<std::shared_ptr<miniros::ServiceClientLink>_>_>_>
                        *)in_stack_ffffffffffffff90,
                       (__normal_iterator<std::shared_ptr<miniros::ServiceClientLink>_*,_std::vector<std::shared_ptr<miniros::ServiceClientLink>,_std::allocator<std::shared_ptr<miniros::ServiceClientLink>_>_>_>
                        *)in_stack_ffffffffffffff88);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<miniros::ServiceClientLink>_*,_std::vector<std::shared_ptr<miniros::ServiceClientLink>,_std::allocator<std::shared_ptr<miniros::ServiceClientLink>_>_>_>
    ::operator*(local_48);
    in_stack_ffffffffffffff88 = (mutex_type *)&stack0xffffffffffffffa0;
    std::shared_ptr<miniros::ServiceClientLink>::shared_ptr
              ((shared_ptr<miniros::ServiceClientLink> *)in_stack_ffffffffffffff90,
               (shared_ptr<miniros::ServiceClientLink> *)in_stack_ffffffffffffff88);
    this_00 = std::
              __shared_ptr_access<miniros::ServiceClientLink,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<miniros::ServiceClientLink,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x4a9869);
    in_stack_ffffffffffffff90 = ServiceClientLink::getConnection(this_00);
    std::__shared_ptr_access<miniros::Connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<miniros::Connection,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
               )0x4a9882);
    Connection::drop((Connection *)lock._M_device,in_stack_0000004c);
    std::shared_ptr<miniros::ServiceClientLink>::~shared_ptr
              ((shared_ptr<miniros::ServiceClientLink> *)0x4a989b);
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<miniros::ServiceClientLink>_*,_std::vector<std::shared_ptr<miniros::ServiceClientLink>,_std::allocator<std::shared_ptr<miniros::ServiceClientLink>_>_>_>
    ::operator++(local_48);
  }
  std::
  vector<std::shared_ptr<miniros::ServiceClientLink>,_std::allocator<std::shared_ptr<miniros::ServiceClientLink>_>_>
  ::~vector((vector<std::shared_ptr<miniros::ServiceClientLink>,_std::allocator<std::shared_ptr<miniros::ServiceClientLink>_>_>
             *)in_stack_ffffffffffffffa0);
  return;
}

Assistant:

void ServicePublication::dropAllConnections()
{
  // Swap our client_links_ list with a local one so we can only lock for a short period of time, because a
  // side effect of our calling drop() on connections can be re-locking the client_links_ mutex
  std::vector<ServiceClientLinkPtr> local_links;

  {
    std::scoped_lock<std::mutex> lock(client_links_mutex_);
    local_links.swap(client_links_);
  }

  for (ServiceClientLinkPtr link: local_links)
    link->getConnection()->drop(Connection::Destructing);
}